

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Decompose_LDLt
          (TPZSkylMatrix<std::complex<float>_> *this,list<long,_std::allocator<long>_> *singular)

{
  char cVar1;
  complex<float> **ppcVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  complex<float> *this_00;
  complex<float> *__z;
  _ComplexT _Var5;
  complex<float> cVar6;
  long lVar7;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  complex<float> local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  _ComplexT local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  cVar1 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed;
  if (cVar1 != '\0') {
    if (cVar1 == '\x04') {
      return 1;
    }
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<float>>::Decompose_LDLt(std::list<int64_t> &) [TVar = std::complex<float>]"
               ,"Decompose_LDLt <Matrix already Decomposed with different decomposition>");
  }
  std::__cxx11::list<long,_std::allocator<long>_>::clear(singular);
  iVar4 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  local_68 = CONCAT44(extraout_var,iVar4);
  _Var5 = 1;
  while ((long)_Var5 < local_68) {
    ppcVar2 = (this->fElem).fStore;
    local_60 = _Var5 * 8;
    local_70 = (_Var5 - ((long)ppcVar2[_Var5 + 1] - (long)ppcVar2[_Var5] >> 3)) + 1;
    local_58 = local_70;
    local_50 = _Var5;
    for (; local_70 <= (long)local_50; local_70 = local_70 + 1) {
      ppcVar2 = (this->fElem).fStore;
      lVar7 = (local_70 - ((long)ppcVar2[local_70 + 1] - (long)ppcVar2[local_70] >> 3)) + 1;
      if (lVar7 < local_58) {
        lVar7 = local_58;
      }
      fVar8 = 0.0;
      fVar9 = 0.0;
      fVar10 = 0.0;
      fVar11 = 0.0;
      this_00 = (complex<float> *)((long)&ppcVar2[local_50][-lVar7]._M_value + local_60);
      __z = ppcVar2[local_70] + (local_70 - lVar7);
      cVar6._M_value = local_50;
      for (; lVar7 < local_70; lVar7 = lVar7 + 1) {
        local_48 = fVar8;
        fStack_44 = fVar9;
        fStack_40 = fVar10;
        fStack_3c = fVar11;
        std::operator*(this_00,__z);
        cVar6._M_value = (_ComplexT)&local_78;
        std::operator*(&local_78,(this->fElem).fStore[lVar7]);
        fVar8 = local_48 + (float)extraout_XMM0_Qa;
        fVar9 = fStack_44 + (float)((ulong)extraout_XMM0_Qa >> 0x20);
        fVar10 = fStack_40 + (float)extraout_XMM0_Qb;
        fVar11 = fStack_3c + (float)((ulong)extraout_XMM0_Qb >> 0x20);
        this_00 = this_00 + -1;
        __z = __z + -1;
      }
      this_00->_M_value =
           CONCAT44((float)(this_00->_M_value >> 0x20) - fVar9,(float)this_00->_M_value - fVar8);
      if (this_00 == __z) {
        bVar3 = IsZero(cVar6);
        if (bVar3) {
          std::__cxx11::list<long,_std::allocator<long>_>::push_back(singular,&local_70);
          this_00->_M_value = 0x3f800000;
        }
      }
      else {
        std::complex<float>::operator/=(this_00,__z);
      }
    }
    _Var5 = local_50 + 1;
  }
  lVar7 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  if (lVar7 != 0) {
    cVar6._M_value = (_ComplexT)this;
    (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x24])(this,lVar7 + -1);
    bVar3 = IsZero(cVar6);
    if (bVar3) {
      local_78._M_value = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow - 1
      ;
      std::__cxx11::list<long,_std::allocator<long>_>::push_back
                (singular,(value_type_conflict5 *)&local_78);
      lVar7 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow + -1;
      local_78._M_value = 0x3f800000;
      (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])(this,lVar7,lVar7,&local_78);
    }
  }
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\x04';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt(std::list<int64_t> &singular)
{
    if( this->fDecomposed == ELDLt) return 1;
    if ( this->fDecomposed )
    {
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    }
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt(singular)");
#endif
    
    singular.clear();
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TVar sum;
    j = 1;
    while(j < dimension) {
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            sum = 0.;
            //EBORIN: 
            // Is this a hot spot?
            while(k < l) {
                sum += *elj-- * *ell-- * *(fElem[k++]);
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
                singular.push_back(l);
                *elj = 1.;
            }
            l++;
        }
        j++;
    }
    
    if(this->Rows() && IsZero(GetVal(this->Rows()-1,this->Rows()-1)))
    {
        singular.push_back(this->Rows()-1);
        PutVal(this->Rows()-1,this->Rows()-1,1.);
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}